

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O0

string * cmIfCommandError_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                   *args)

{
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *this;
  bool bVar1;
  string *this_00;
  WrapQuotes in_R8D;
  string_view str;
  undefined1 auVar2 [16];
  string local_70;
  cmExpandedCommandArgument *local_50;
  cmExpandedCommandArgument *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *__range1;
  allocator<char> local_1a;
  undefined1 local_19;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *local_18;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args_local;
  string *err;
  
  local_19 = 0;
  local_18 = args;
  args_local = (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"given arguments:\n ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  this = local_18;
  __end1 = std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                     (local_18);
  i = (cmExpandedCommandArgument *)
      std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
                                     *)&i), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
               ::operator*(&__end1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    this_00 = cmExpandedCommandArgument::GetValue_abi_cxx11_(local_50);
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    str._M_len = auVar2._8_8_;
    str._M_str = (char *)0x0;
    cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_70,auVar2._0_8_,str,in_R8D);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    __gnu_cxx::
    __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  return __return_storage_ptr__;
}

Assistant:

static std::string cmIfCommandError(
  std::vector<cmExpandedCommandArgument> const& args)
{
  std::string err = "given arguments:\n ";
  for (cmExpandedCommandArgument const& i : args) {
    err += " ";
    err += cmOutputConverter::EscapeForCMake(i.GetValue());
  }
  err += "\n";
  return err;
}